

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O1

string * __thiscall
sentencepiece::normalizer::Normalizer::EncodePrecompiledCharsMap_abi_cxx11_
          (string *__return_storage_ptr__,Normalizer *this,string_view trie_blob,
          string_view normalized)

{
  string s;
  undefined4 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_48 = 0;
  local_40 = 0;
  local_50 = (undefined4 *)&local_40;
  std::__cxx11::string::resize((ulong)&local_50,'\x04');
  *local_50 = (int)this;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != (undefined4 *)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,trie_blob._M_len);
  std::__cxx11::string::append((char *)__return_storage_ptr__,normalized._M_len);
  return __return_storage_ptr__;
}

Assistant:

std::string Normalizer::EncodePrecompiledCharsMap(
    absl::string_view trie_blob, absl::string_view normalized) {
  // <trie size(4byte)><double array trie><normalized string>
  std::string blob;
  blob.append(string_util::EncodePOD<uint32_t>(trie_blob.size()));
  blob.append(trie_blob.data(), trie_blob.size());

#ifdef IS_BIG_ENDIAN
  uint32_t *data = reinterpret_cast<uint32_t *>(blob.data());
  for (int i = 0; i < blob.size() / 4; ++i) data[i] = util::Swap32(data[i]);
#endif

  blob.append(normalized.data(), normalized.size());

  return blob;
}